

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mappingEx.cpp
# Opt level: O2

int main(void)

{
  int mapMe;
  ostream *poVar1;
  int mapInt;
  vector<int,_std::allocator<int>_> mapIntMappings;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mapStringMappings;
  vector<double,_std::allocator<double>_> mapDoubleMappings;
  double mapDouble;
  string mapString;
  string mapStringResult;
  allocator local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  int local_12c;
  _Vector_base<int,_std::allocator<int>_> local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  _Vector_base<double,_std::allocator<double>_> local_e8;
  double local_c8;
  double local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  _Vector_base<double,_std::allocator<double>_> local_a0;
  _Vector_base<int,_std::allocator<int>_> local_88;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator local_30 [32];
  
  local_128._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_12c = 0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8 = 0.0;
  std::__cxx11::string::string(local_70,"",local_30);
  std::__cxx11::string::string((string *)local_30,"",(allocator *)&local_150);
  local_150._M_dataplus._M_p._0_4_ = 100;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_128,(int *)&local_150);
  local_150._M_dataplus._M_p._0_4_ = 200;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_128,(int *)&local_150);
  local_150._M_dataplus._M_p._0_4_ = 300;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_128,(int *)&local_150);
  local_150._M_dataplus._M_p._0_4_ = 400;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_128,(int *)&local_150);
  local_150._M_dataplus._M_p._0_4_ = 500;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_128,(int *)&local_150);
  local_150._M_dataplus._M_p._0_4_ = 600;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_128,(int *)&local_150);
  local_150._M_dataplus._M_p = (pointer)0xc028000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)&local_e8,(double *)&local_150);
  local_150._M_dataplus._M_p = (pointer)0xc018000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)&local_e8,(double *)&local_150);
  local_150._M_dataplus._M_p = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)&local_e8,(double *)&local_150);
  local_150._M_dataplus._M_p = (pointer)0x4018000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)&local_e8,(double *)&local_150);
  local_150._M_dataplus._M_p = (pointer)0x4028000000000000;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)&local_e8,(double *)&local_150);
  std::__cxx11::string::string((string *)&local_150,"A",&local_151);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
             &local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_150,"E",&local_151);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
             &local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_150,"I",&local_151);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
             &local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_150,"O",&local_151);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
             &local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string((string *)&local_150,"U",&local_151);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
             &local_150);
  std::__cxx11::string::~string((string *)&local_150);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar1,"Enter an integer value to map: ");
  std::istream::operator>>((istream *)&std::cin,&local_12c);
  mapMe = local_12c;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_88,
             (vector<int,_std::allocator<int>_> *)&local_128);
  GetMapping<int>(mapMe,(vector<int,_std::allocator<int>_> *)&local_88);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar1,"Enter a double value to map: ");
  std::istream::_M_extract<double>((double *)&std::cin);
  local_c0 = local_c8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_a0,
             (vector<double,_std::allocator<double>_> *)&local_e8);
  GetMapping<double>(local_c0,(vector<double,_std::allocator<double>_> *)&local_a0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a0);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar1,"Enter a string value to map: ");
  std::operator>>((istream *)&std::cin,local_70);
  std::__cxx11::string::string((string *)&local_50,local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b8,&local_108);
  GetMapping<std::__cxx11::string>(&local_150,&local_50,&local_b8);
  std::__cxx11::string::operator=((string *)local_30,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)local_30);
  std::__cxx11::string::~string(local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_128);
  return 0;
}

Assistant:

int main() {
   vector<int> mapIntMappings;
   vector<double> mapDoubleMappings;
   vector<string> mapStringMappings;
   int mapInt = 0;
   int mapIntResult = 0;
   double mapDouble = 0.0;
   double mapDoubleResult = 0.0;
   string mapString = "";
   string mapStringResult = "";

   // Initialize mapping entries
   mapIntMappings.push_back(100);
   mapIntMappings.push_back(200);
   mapIntMappings.push_back(300);
   mapIntMappings.push_back(400);
   mapIntMappings.push_back(500);
   mapIntMappings.push_back(600);

   // Initialize mapping entries for doubles
   mapDoubleMappings.push_back(-12.0);
   mapDoubleMappings.push_back(-6.0);
   mapDoubleMappings.push_back(0.0);
   mapDoubleMappings.push_back(6.0);
   mapDoubleMappings.push_back(12.0);
   // FIXME: Add more entries here

   // Initialize mapping entries for strings
   mapStringMappings.push_back("A");
   // FIXME: Add more entries here
   mapStringMappings.push_back("E");
    mapStringMappings.push_back("I");
    mapStringMappings.push_back("O");
    mapStringMappings.push_back("U");

   cout << endl << "Enter an integer value to map: ";
   cin >> mapInt;
   mapIntResult = GetMapping(mapInt, mapIntMappings);

   // FIXME: Add code similar to the integer processing to process
   //        a double and a string

   cout<<endl<< "Enter a double value to map: ";
   cin>>mapDouble;
   mapDoubleResult = GetMapping(mapDouble,mapDoubleMappings);

    cout<<endl<<"Enter a string value to map: ";
    cin>>mapString;
    mapStringResult = GetMapping(mapString, mapStringMappings);



   return 0;
}